

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O3

void mmt_decode(mmt_decode_funcs *funcs,void *state)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  byte *pbVar4;
  mmt_dup_syscall *pmVar5;
  void *pvVar6;
  mmt_open *pmVar7;
  mmt_mmap2 *pmVar8;
  mmt_mremap *pmVar9;
  mmt_ioctl_post_v2 *pmVar10;
  _func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *p_Var11;
  mmt_mmap *pmVar12;
  mmt_unmap *pmVar13;
  _func_void_mmt_open_ptr_void_ptr *p_Var14;
  mmt_sync *pmVar15;
  char *pcVar16;
  mmt_buf *buf;
  void *pvVar17;
  undefined8 *extraout_RDX;
  uint uVar18;
  int iVar19;
  long lVar20;
  mmt_buf **ppmVar21;
  uint *puVar22;
  uint *puVar23;
  uint uVar24;
  mmt_buf *b;
  mmt_memory_dump_v2_prefix *d;
  mmt_memory_dump args [20];
  mmt_ioctl_post_v2 *local_230;
  mmt_buf *local_228;
  mmt_memory_dump_v2_prefix *local_220;
  mmt_memory_dump local_218 [20];
  
  puVar22 = (uint *)0x0;
  pbVar4 = (byte *)mmt_load_data_with_prefix(1,0,1);
  if (pbVar4 != (byte *)0x0) {
    do {
      bVar1 = *pbVar4;
      puVar23 = puVar22;
      if (bVar1 < 0x53) {
        if (bVar1 < 0x4d) {
          if ((bVar1 != 0x2d) && (bVar1 != 0x3d)) goto switchD_00251c12_caseD_66;
          uVar18 = 1;
          while (mmt_buf[(uVar18 + mmt_idx) - 1] != '\n') {
            pvVar6 = mmt_load_data_with_prefix(uVar18,0,0);
            uVar18 = uVar18 + 1;
            if (pvVar6 == (void *)0x0) {
              return;
            }
          }
          if (funcs->msg != (_func_void_uint8_t_ptr_uint_void_ptr *)0x0) {
            (*funcs->msg)(mmt_buf + mmt_idx,uVar18 - 1,state);
          }
          mmt_idx = mmt_idx + uVar18;
        }
        else {
          if (bVar1 != 0x4d) {
            if (bVar1 != 0x52) goto switchD_00251c12_caseD_66;
            pvVar6 = mmt_load_data_with_prefix(0xb,0,0);
            uVar18 = *(byte *)((long)pvVar6 + 9) + 0xb;
            pmVar7 = (mmt_open *)mmt_load_data_with_prefix(uVar18,0,0);
            mmt_check_eor(uVar18);
            p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memread2;
            goto LAB_002520a3;
          }
          pmVar8 = (mmt_mmap2 *)mmt_load_data_with_prefix(0x2a,0,0);
          mmt_check_eor(0x2a);
          if (funcs->mmap2 != (_func_void_mmt_mmap2_ptr_void_ptr *)0x0) {
            (*funcs->mmap2)(pmVar8,state);
          }
          mmt_idx = mmt_idx + 0x2a;
        }
        goto LAB_002520bd;
      }
      puVar23 = &switchD_00251c12::switchdataD_00275450;
      switch(bVar1) {
      case 100:
        pmVar5 = (mmt_dup_syscall *)mmt_load_data_with_prefix(10,0,0);
        mmt_check_eor(10);
        if (funcs->dup_syscall != (_func_void_mmt_dup_syscall_ptr_void_ptr *)0x0) {
          (*funcs->dup_syscall)(pmVar5,state);
        }
        mmt_idx = mmt_idx + 10;
        break;
      case 0x65:
        pmVar9 = (mmt_mremap *)mmt_load_data_with_prefix(0x3e,0,0);
        mmt_check_eor(0x3e);
        if (funcs->mremap != (_func_void_mmt_mremap_ptr_void_ptr *)0x0) {
          (*funcs->mremap)(pmVar9,state);
        }
        mmt_idx = mmt_idx + 0x3e;
        break;
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6b:
      case 0x6c:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
switchD_00251c12_caseD_66:
        mmt_decode_cold_1();
        puVar23[0] = 0;
        puVar23[1] = 0;
        *extraout_RDX = 0;
        uVar18 = (uint)pbVar4;
        pcVar16 = (char *)mmt_load_data_with_prefix(1,uVar18,1);
        if ((pcVar16 != (char *)0x0) && (*pcVar16 == 'y')) {
          pvVar6 = mmt_load_data_with_prefix(9,uVar18,0);
          buf = (mmt_buf *)mmt_load_data_with_prefix(4,uVar18 + 9,0);
          mmt_buf_check_sanity(buf);
          uVar2 = buf->len;
          pvVar17 = mmt_load_data_with_prefix(uVar2 + 5,uVar18 + 9,0);
          mmt_check_eor(uVar18 + uVar2 + 0xe);
          *(void **)puVar23 = pvVar6;
          *extraout_RDX = pvVar17;
        }
        return;
      case 0x69:
        do {
          pvVar6 = mmt_load_data_with_prefix(0xe,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar6 + 9));
          uVar24 = *(int *)((long)pvVar6 + 9) + 0xe;
          local_230 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar24,0,0);
          mmt_check_eor(uVar24);
          ppmVar21 = &local_218[0].data;
          lVar20 = 0;
          uVar18 = uVar24;
          do {
            uVar3 = load_memory_dump_v2(uVar18,&local_220,&local_228);
            if (uVar3 == 0) goto LAB_00251eb7;
            ((mmt_memory_dump *)(ppmVar21 + -2))->addr = local_220->addr;
            *ppmVar21 = local_228;
            ppmVar21[-1] = (mmt_buf *)0x0;
            lVar20 = lVar20 + 1;
            uVar18 = uVar18 + uVar3;
            ppmVar21 = ppmVar21 + 3;
          } while (lVar20 != 0x14);
          lVar20 = 0x14;
LAB_00251eb7:
          iVar19 = (int)lVar20;
          pmVar10 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar24,0,0);
        } while (local_230 != pmVar10);
        p_Var11 = (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)
                  funcs->ioctl_pre;
        goto LAB_00251fd4;
      case 0x6a:
        do {
          pvVar6 = mmt_load_data_with_prefix(0x1e,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar6 + 0x19));
          uVar24 = *(int *)((long)pvVar6 + 0x19) + 0x1e;
          local_230 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar24,0,0);
          mmt_check_eor(uVar24);
          ppmVar21 = &local_218[0].data;
          lVar20 = 0;
          uVar18 = uVar24;
          do {
            uVar3 = load_memory_dump_v2(uVar18,&local_220,&local_228);
            if (uVar3 == 0) goto LAB_00251fb1;
            ((mmt_memory_dump *)(ppmVar21 + -2))->addr = local_220->addr;
            *ppmVar21 = local_228;
            ppmVar21[-1] = (mmt_buf *)0x0;
            lVar20 = lVar20 + 1;
            uVar18 = uVar18 + uVar3;
            ppmVar21 = ppmVar21 + 3;
          } while (lVar20 != 0x14);
          lVar20 = 0x14;
LAB_00251fb1:
          iVar19 = (int)lVar20;
          pmVar10 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar24,0,0);
        } while (local_230 != pmVar10);
        p_Var11 = funcs->ioctl_post;
LAB_00251fd4:
        if (p_Var11 != (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)0x0) {
          (*p_Var11)(local_230,state,local_218,iVar19);
        }
        mmt_idx = mmt_idx + uVar18;
        break;
      case 0x6d:
        pmVar12 = (mmt_mmap *)mmt_load_data_with_prefix(0x1e,0,0);
        mmt_check_eor(0x1e);
        if (funcs->mmap != (_func_void_mmt_mmap_ptr_void_ptr *)0x0) {
          (*funcs->mmap)(pmVar12,state);
        }
        mmt_idx = mmt_idx + 0x1e;
        break;
      case 0x6e:
        mmt_decode_nvidia((mmt_nvidia_decode_funcs *)funcs,state);
        break;
      case 0x6f:
        pvVar6 = mmt_load_data_with_prefix(0x12,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar6 + 0xd));
        uVar18 = *(int *)((long)pvVar6 + 0xd) + 0x12;
        pmVar7 = (mmt_open *)mmt_load_data_with_prefix(uVar18,0,0);
        mmt_check_eor(uVar18);
        p_Var14 = funcs->open;
        goto LAB_002520a3;
      case 0x72:
        pvVar6 = mmt_load_data_with_prefix(0xb,0,0);
        uVar18 = *(byte *)((long)pvVar6 + 9) + 0xb;
        pmVar7 = (mmt_open *)mmt_load_data_with_prefix(uVar18,0,0);
        mmt_check_eor(uVar18);
        p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memread;
        goto LAB_002520a3;
      case 0x74:
        pvVar6 = mmt_load_data_with_prefix(10,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar6 + 5));
        uVar18 = *(int *)((long)pvVar6 + 5) + 10;
        pmVar7 = (mmt_open *)mmt_load_data_with_prefix(uVar18,0,0);
        mmt_check_eor(uVar18);
        p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->write_syscall;
        goto LAB_002520a3;
      case 0x75:
        pmVar13 = (mmt_unmap *)mmt_load_data_with_prefix(0x2e,0,0);
        mmt_check_eor(0x2e);
        if (funcs->munmap != (_func_void_mmt_unmap_ptr_void_ptr *)0x0) {
          (*funcs->munmap)(pmVar13,state);
        }
        mmt_idx = mmt_idx + 0x2e;
        break;
      case 0x77:
        pvVar6 = mmt_load_data_with_prefix(0xb,0,0);
        uVar18 = *(byte *)((long)pvVar6 + 9) + 0xb;
        pmVar7 = (mmt_open *)mmt_load_data_with_prefix(uVar18,0,0);
        mmt_check_eor(uVar18);
        p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memwrite;
LAB_002520a3:
        if (p_Var14 != (_func_void_mmt_open_ptr_void_ptr *)0x0) {
          (*p_Var14)(pmVar7,state);
        }
        mmt_idx = mmt_idx + uVar18;
        break;
      default:
        if (bVar1 != 0x53) {
          puVar23 = puVar22;
          if (bVar1 != 0x57) goto switchD_00251c12_caseD_66;
          pvVar6 = mmt_load_data_with_prefix(0xb,0,0);
          uVar18 = *(byte *)((long)pvVar6 + 9) + 0xb;
          pmVar7 = (mmt_open *)mmt_load_data_with_prefix(uVar18,0,0);
          mmt_check_eor(uVar18);
          p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memwrite2;
          goto LAB_002520a3;
        }
        pmVar15 = (mmt_sync *)mmt_load_data_with_prefix(6,0,0);
        mmt_check_eor(6);
        if (funcs->sync != (_func_void_mmt_sync_ptr_void_ptr *)0x0) {
          (*funcs->sync)(pmVar15,state);
        }
        mmt_idx = mmt_idx + 6;
      }
LAB_002520bd:
      puVar22 = (uint *)0x0;
      pbVar4 = (byte *)mmt_load_data_with_prefix(1,0,1);
    } while (pbVar4 != (byte *)0x0);
  }
  return;
}

Assistant:

void mmt_decode(const struct mmt_decode_funcs *funcs, void *state)
{
	unsigned int size;
	while (1)
	{
		struct mmt_message *msg = mmt_load_initial_data();
		if (msg == NULL)
			return;

		if (msg->type == '=' || msg->type == '-')
		{
			unsigned int len = 0;
			while (mmt_buf[mmt_idx + len] != 10)
				if (mmt_load_data(++len) == NULL)
					return;

			if (funcs->msg)
				funcs->msg(&mmt_buf[mmt_idx], len, state);

			mmt_idx += len + 1;
		}
		else if (msg->type == 'r') // read
		{
			struct mmt_read *w;
			size = sizeof(struct mmt_read) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread)
				funcs->memread(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'R') // read2
		{
			struct mmt_read2 *w;
			size = sizeof(struct mmt_read2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread2)
				funcs->memread2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'w') // write
		{
			struct mmt_write *w;
			size = sizeof(struct mmt_write) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite)
				funcs->memwrite(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'W') // write2
		{
			struct mmt_write2 *w;
			size = sizeof(struct mmt_write2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite2)
				funcs->memwrite2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'M') // mmap v2
		{
			size = sizeof(struct mmt_mmap2) + 1;
			struct mmt_mmap2 *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap2)
				funcs->mmap2(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'm') // mmap
		{
			size = sizeof(struct mmt_mmap) + 1;
			struct mmt_mmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap)
				funcs->mmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'u') // unmap
		{
			size = sizeof(struct mmt_unmap) + 1;
			struct mmt_unmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->munmap)
				funcs->munmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'e') // mremap
		{
			size = sizeof(struct mmt_mremap) + 1;
			struct mmt_mremap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mremap)
				funcs->mremap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'o') // open
		{
			size = sizeof(struct mmt_open) + 1;
			struct mmt_open *o;
			o = mmt_load_data(size);
			mmt_buf_check_sanity(&o->path);
			size += o->path.len;
			o = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->open)
				funcs->open(o, state);

			mmt_idx += size;
		}
		else if (msg->type == 'n') // nvidia / nouveau
			mmt_decode_nvidia((struct mmt_nvidia_decode_funcs *)funcs, state);
		else if (msg->type == 't') // write syscall
		{
			struct mmt_write_syscall *w;
			size = sizeof(struct mmt_write_syscall) + 1;
			w = mmt_load_data(size);
			mmt_buf_check_sanity(&w->data);
			size += w->data.len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->write_syscall)
				funcs->write_syscall(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'S') // sync
		{
			size = sizeof(struct mmt_sync) + 1;
			struct mmt_sync *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->sync)
				funcs->sync(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'd') // dup syscall
		{
			size = sizeof(struct mmt_dup_syscall) + 1;
			struct mmt_dup_syscall *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->dup_syscall)
				funcs->dup_syscall(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'i') // ioctl pre
		{
#define MAX_ARGS 20
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_pre_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_pre_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_pre)
				funcs->ioctl_pre(ctl, state, args, argc);

			mmt_idx += pfx;
		}
		else if (msg->type == 'j')
		{
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_post_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_post_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_post)
				funcs->ioctl_post(ctl, state, args, argc);

			mmt_idx += pfx;
#undef MAX_ARGS
		}
		else
		{
			fflush(stdout);
			fprintf(stderr, "unknown type: 0x%x\n", msg->type);
			fprintf(stderr, "%c\n", msg->type);
			mmt_dump_next();
			exit(1);
		}
	}
}